

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * ParsePhp(TidyDocImpl *doc)

{
  Lexer *lexer_00;
  uint uVar1;
  Node *local_28;
  Node *php;
  uint c;
  Lexer *lexer;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  local_28 = (Node *)0x0;
  lexer_00->txtstart = lexer_00->lexsize;
  do {
    do {
      uVar1 = prvTidyReadChar(doc->docIn);
      if (uVar1 == 0xffffffff) goto LAB_0015cba9;
      prvTidyAddCharToLexer(lexer_00,uVar1);
    } while (uVar1 != 0x3f);
    uVar1 = prvTidyReadChar(doc->docIn);
    if (uVar1 == 0xffffffff) goto LAB_0015cba9;
    prvTidyAddCharToLexer(lexer_00,uVar1);
  } while (uVar1 != 0x3e);
  lexer_00->lexsize = lexer_00->lexsize - 2;
LAB_0015cba9:
  lexer_00->txtend = lexer_00->lexsize;
  if (lexer_00->txtstart < lexer_00->txtend) {
    local_28 = NewToken(doc,PhpTag);
  }
  lexer_00->txtstart = lexer_00->txtend;
  return local_28;
}

Assistant:

static Node *ParsePhp( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    uint c;
    Node *php = NULL;

    lexer->txtstart = lexer->lexsize;

    for (;;)
    {
        if ((c = TY_(ReadChar)(doc->docIn)) == EndOfStream)
            break;

        TY_(AddCharToLexer)(lexer, c);


        if (c != '?')
            continue;

        if ((c = TY_(ReadChar)(doc->docIn)) == EndOfStream)
            break;

        TY_(AddCharToLexer)(lexer, c);

        if (c == '>')
        {
            lexer->lexsize -= 2;
            break;
        }
    }

    lexer->txtend = lexer->lexsize;
    if (lexer->txtend > lexer->txtstart)
        php = PhpToken(doc);

    lexer->txtstart = lexer->txtend;
    return php;
}